

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer-shared.cpp
# Opt level: O3

Ref makeSigning(Ref node,JsSign sign)

{
  size_t sVar1;
  Value *this;
  Ref RVar2;
  undefined8 *puVar3;
  void *__ptr;
  size_t *psVar4;
  Ref in_R8;
  IString op;
  
  if (sign - JS_SIGNED < 2) {
    puVar3 = &cashew::TRSHIFT;
    psVar4 = &DAT_010b15c0;
    if (sign == JS_SIGNED) {
      puVar3 = &cashew::OR;
    }
    RVar2.inst = (Value *)*puVar3;
    if (sign == JS_SIGNED) {
      psVar4 = &DAT_010b14c0;
    }
    sVar1 = *psVar4;
    __ptr = (void *)0x18;
    this = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    this->type = Null;
    cashew::Value::free(this,__ptr);
    this->type = Number;
    (this->field_1).str.str._M_len = 0;
    op.str._M_str = (char *)this;
    op.str._M_len = sVar1;
    RVar2 = cashew::ValueBuilder::makeBinary(node.inst,RVar2,op,in_R8);
    return (Ref)RVar2.inst;
  }
  __assert_fail("sign == JS_SIGNED || sign == JS_UNSIGNED",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/optimizer-shared.cpp"
                ,0x88,"Ref makeSigning(Ref, JsSign)");
}

Assistant:

Ref makeSigning(Ref node, JsSign sign) {
  assert(sign == JS_SIGNED || sign == JS_UNSIGNED);
  return ValueBuilder::makeBinary(
    node, sign == JS_SIGNED ? OR : TRSHIFT, ValueBuilder::makeNum(0));
}